

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCex.c
# Opt level: O3

int Gia_ManFindFailedPoCex(Gia_Man_t *pAig,Abc_Cex_t *p,int nOutputs)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  
  if (pAig->vCis->nSize - pAig->nRegs != p->nPis) {
    __assert_fail("Gia_ManPiNum(pAig) == p->nPis",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCex.c"
                  ,0x5f,"int Gia_ManFindFailedPoCex(Gia_Man_t *, Abc_Cex_t *, int)");
  }
  Gia_ManCleanMark0(pAig);
  iVar8 = pAig->nRegs;
  if (0 < iVar8) {
    uVar5 = 0;
    do {
      iVar11 = pAig->vCis->nSize;
      uVar9 = (iVar11 - iVar8) + uVar5;
      if (((int)uVar9 < 0) || (iVar11 <= (int)uVar9)) goto LAB_00710b2c;
      iVar11 = pAig->vCis->pArray[uVar9];
      lVar10 = (long)iVar11;
      if ((lVar10 < 0) || (pAig->nObjs <= iVar11)) goto LAB_00710b0d;
      pGVar3 = pAig->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar9 = uVar5 + 1;
      *(ulong *)(pGVar3 + lVar10) =
           *(ulong *)(pGVar3 + lVar10) & 0xffffffffbfffffff |
           (ulong)(((uint)(&p[1].iPo)[uVar5 >> 5] >> ((byte)uVar5 & 0x1f) & 1) << 0x1e);
      iVar8 = pAig->nRegs;
      uVar5 = uVar9;
    } while ((int)uVar9 < iVar8);
  }
  uVar5 = p->nRegs;
  if (-1 < p->iFrame) {
    iVar11 = 0;
    do {
      pVVar7 = pAig->vCis;
      uVar12 = (ulong)(uint)pVVar7->nSize;
      if (iVar8 < pVVar7->nSize) {
        lVar10 = 0;
        do {
          if ((int)uVar12 <= lVar10) goto LAB_00710b2c;
          lVar13 = (long)pVVar7->pArray[lVar10];
          if ((lVar13 < 0) || (iVar8 = pAig->nObjs, iVar8 <= pVVar7->pArray[lVar10]))
          goto LAB_00710b0d;
          pGVar3 = pAig->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) {
            uVar5 = uVar5 + (int)lVar10;
            goto LAB_0071089d;
          }
          *(ulong *)(pGVar3 + lVar13) =
               *(ulong *)(pGVar3 + lVar13) & 0xffffffffbfffffff |
               (ulong)(((uint)(&p[1].iPo)[(int)((ulong)uVar5 + lVar10) >> 5] >>
                        ((byte)((ulong)uVar5 + lVar10) & 0x1f) & 1) << 0x1e);
          lVar10 = lVar10 + 1;
          pVVar7 = pAig->vCis;
          uVar12 = (ulong)pVVar7->nSize;
        } while (lVar10 < (long)(uVar12 - (long)pAig->nRegs));
        uVar5 = uVar5 + (int)lVar10;
      }
      iVar8 = pAig->nObjs;
      if (0 < iVar8) {
LAB_0071089d:
        lVar10 = 0;
        lVar13 = 0;
        do {
          pGVar3 = pAig->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          uVar12 = *(ulong *)(&pGVar3->field_0x0 + lVar10);
          if ((uVar12 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar12) {
            *(ulong *)(&pGVar3->field_0x0 + lVar10) =
                 uVar12 & 0xffffffff3fffffff |
                 (ulong)((((uint)(uVar12 >> 0x3d) ^
                          *(uint *)((long)pGVar3 +
                                   (ulong)((uint)(uVar12 >> 0x1e) & 0x7ffffffc) * -3 + lVar10) >>
                          0x1e) & ((uint)(uVar12 >> 0x1d) & 7 ^
                                  *(uint *)((long)pGVar3 +
                                           (ulong)(uint)((int)(uVar12 & 0x1fffffff) << 2) * -3 +
                                           lVar10) >> 0x1e) & 1) << 0x1e);
            iVar8 = pAig->nObjs;
          }
          lVar13 = lVar13 + 1;
          lVar10 = lVar10 + 0xc;
        } while (lVar13 < iVar8);
      }
      pVVar7 = pAig->vCos;
      if (0 < pVVar7->nSize) {
        lVar10 = 0;
        do {
          iVar8 = pVVar7->pArray[lVar10];
          if (((long)iVar8 < 0) || (pAig->nObjs <= iVar8)) goto LAB_00710b0d;
          if (pAig->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar3 = pAig->pObjs + iVar8;
          uVar9 = (uint)*(ulong *)pGVar3;
          *(ulong *)pGVar3 =
               *(ulong *)pGVar3 & 0xffffffffbfffffff |
               (ulong)((uVar9 * 2 ^ *(uint *)(pGVar3 + -(ulong)(uVar9 & 0x1fffffff))) & 0x40000000);
          lVar10 = lVar10 + 1;
          pVVar7 = pAig->vCos;
        } while (lVar10 < pVVar7->nSize);
      }
      iVar8 = pAig->nRegs;
      if (0 < iVar8) {
        iVar6 = 0;
        do {
          iVar1 = pAig->vCos->nSize;
          uVar9 = (iVar1 - iVar8) + iVar6;
          if (((int)uVar9 < 0) || (iVar1 <= (int)uVar9)) goto LAB_00710b2c;
          iVar1 = pAig->vCos->pArray[uVar9];
          if (((long)iVar1 < 0) || (pAig->nObjs <= iVar1)) goto LAB_00710b0d;
          pGVar3 = pAig->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          iVar2 = pAig->vCis->nSize;
          uVar9 = (iVar2 - iVar8) + iVar6;
          if (((int)uVar9 < 0) || (iVar2 <= (int)uVar9)) goto LAB_00710b2c;
          uVar9 = pAig->vCis->pArray[uVar9];
          lVar10 = (long)(int)uVar9;
          if ((lVar10 < 0) || ((uint)pAig->nObjs <= uVar9)) goto LAB_00710b0d;
          *(ulong *)(pGVar3 + lVar10) =
               *(ulong *)(pGVar3 + lVar10) & 0xffffffffbfffffff |
               (ulong)((uint)*(undefined8 *)(pGVar3 + iVar1) & 0x40000000);
          iVar6 = iVar6 + 1;
          iVar8 = pAig->nRegs;
        } while (iVar6 < iVar8);
      }
      bVar4 = iVar11 < p->iFrame;
      iVar11 = iVar11 + 1;
    } while (bVar4);
  }
  if (uVar5 != p->nBits) {
    __assert_fail("iBit == p->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCex.c"
                  ,0x70,"int Gia_ManFindFailedPoCex(Gia_Man_t *, Abc_Cex_t *, int)");
  }
  iVar11 = pAig->vCos->nSize;
  iVar8 = iVar11 - iVar8;
  if (nOutputs < iVar8) {
    uVar12 = (ulong)(uint)nOutputs;
    do {
      if ((nOutputs < 0) || (iVar11 <= (int)uVar12)) {
LAB_00710b2c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar6 = pAig->vCos->pArray[uVar12];
      if (((long)iVar6 < 0) || (pAig->nObjs <= iVar6)) {
LAB_00710b0d:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if ((pAig->pObjs[iVar6].field_0x3 & 0x40) != 0) goto LAB_00710af3;
      uVar12 = uVar12 + 1;
    } while ((int)uVar12 < iVar8);
  }
  uVar12 = 0xffffffff;
LAB_00710af3:
  Gia_ManCleanMark0(pAig);
  return (int)uVar12;
}

Assistant:

int Gia_ManFindFailedPoCex( Gia_Man_t * pAig, Abc_Cex_t * p, int nOutputs )
{
    Gia_Obj_t * pObj, * pObjRi, * pObjRo;
    int RetValue, i, k, iBit = 0;
    assert( Gia_ManPiNum(pAig) == p->nPis );
    Gia_ManCleanMark0(pAig);
    Gia_ManForEachRo( pAig, pObj, i )
        pObj->fMark0 = Abc_InfoHasBit(p->pData, iBit++);
    iBit = p->nRegs;
    for ( i = 0; i <= p->iFrame; i++ )
    {
        Gia_ManForEachPi( pAig, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(p->pData, iBit++);
        Gia_ManForEachAnd( pAig, pObj, k )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                           (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( pAig, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
        Gia_ManForEachRiRo( pAig, pObjRi, pObjRo, k )
            pObjRo->fMark0 = pObjRi->fMark0;
    }
    assert( iBit == p->nBits );
    // figure out the number of failed output
    RetValue = -1;
//    for ( i = Gia_ManPoNum(pAig) - 1; i >= nOutputs; i-- )
    for ( i = nOutputs; i < Gia_ManPoNum(pAig); i++ )
    {
        if ( Gia_ManPo(pAig, i)->fMark0 )
        {
            RetValue = i;
            break;
        }
    }
    Gia_ManCleanMark0(pAig);
    return RetValue;
}